

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.h
# Opt level: O1

int callbackKeyCompare(void *privdata,void *key1,void *key2)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  switch(*(byte *)((long)key1 + -1) & 7) {
  case 0:
    uVar3 = (uint)(*(byte *)((long)key1 + -1) >> 3);
    break;
  case 1:
    uVar3 = (uint)*(byte *)((long)key1 + -3);
    break;
  case 2:
    uVar3 = (uint)*(ushort *)((long)key1 + -5);
    break;
  case 3:
    uVar3 = *(uint *)((long)key1 + -9);
    break;
  case 4:
    uVar3 = (uint)*(undefined8 *)((long)key1 + -0x11);
    break;
  default:
    uVar3 = 0;
  }
  uVar1 = 0;
  switch(*(byte *)((long)key2 + -1) & 7) {
  case 0:
    uVar4 = (uint)(*(byte *)((long)key2 + -1) >> 3);
    break;
  case 1:
    uVar4 = (uint)*(byte *)((long)key2 + -3);
    break;
  case 2:
    uVar4 = (uint)*(ushort *)((long)key2 + -5);
    break;
  case 3:
    uVar4 = *(uint *)((long)key2 + -9);
    break;
  case 4:
    uVar4 = (uint)*(undefined8 *)((long)key2 + -0x11);
    break;
  default:
    uVar4 = 0;
  }
  if (uVar3 == uVar4) {
    iVar2 = bcmp(key1,key2,(long)(int)uVar3);
    uVar1 = (uint)(iVar2 == 0);
  }
  return uVar1;
}

Assistant:

static inline size_t sdslen(const sds s) {
    unsigned char flags = s[-1];
    switch(flags&SDS_TYPE_MASK) {
        case SDS_TYPE_5:
            return SDS_TYPE_5_LEN(flags);
        case SDS_TYPE_8:
            return SDS_HDR(8,s)->len;
        case SDS_TYPE_16:
            return SDS_HDR(16,s)->len;
        case SDS_TYPE_32:
            return SDS_HDR(32,s)->len;
        case SDS_TYPE_64:
            return SDS_HDR(64,s)->len;
    }
    return 0;
}